

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

void __thiscall iqxmlrpc::Server::push_interceptor(Server *this,Interceptor *ic)

{
  element_type *ic_00;
  Interceptor *ic_local;
  Server *this_local;
  
  ic_00 = std::auto_ptr<iqxmlrpc::Interceptor>::release(&this->impl->interceptors);
  Interceptor::nest(ic,ic_00);
  std::auto_ptr<iqxmlrpc::Interceptor>::reset(&this->impl->interceptors,ic);
  return;
}

Assistant:

void Server::push_interceptor(Interceptor* ic)
{
  ic->nest(impl->interceptors.release());
  impl->interceptors.reset(ic);
}